

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_min_filled(resampler *r)

{
  resampler *r_local;
  int local_4;
  
  switch(r->quality) {
  default:
    local_4 = 1;
    break;
  case '\x02':
  case '\x03':
    local_4 = 2;
    break;
  case '\x04':
    local_4 = 4;
    break;
  case '\x05':
    local_4 = 0x20;
  }
  return local_4;
}

Assistant:

static int resampler_min_filled(resampler *r)
{
    switch (r->quality)
    {
    default:
    case RESAMPLER_QUALITY_ZOH:
    case RESAMPLER_QUALITY_BLEP:
        return 1;
            
    case RESAMPLER_QUALITY_LINEAR:
    case RESAMPLER_QUALITY_BLAM:
        return 2;
            
    case RESAMPLER_QUALITY_CUBIC:
        return 4;
            
    case RESAMPLER_QUALITY_SINC:
        return SINC_WIDTH * 2;
    }
}